

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  uint uVar1;
  SPIRType *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ExecutionModel EVar6;
  TypedID<(spirv_cross::Types)2> TVar7;
  CompilerError *pCVar8;
  size_t sVar9;
  TypedID *pTVar10;
  TypedID<(spirv_cross::Types)1> *pTVar11;
  bool local_489;
  byte local_403;
  bool local_402;
  bool local_401;
  SPIRType *local_3f0;
  bool attribute_load_store_1;
  bool storage_is_stage_io_1;
  bool is_composite_type_1;
  string local_3d0 [32];
  ID local_3b0;
  allocator local_3a9;
  string local_3a8 [32];
  ID local_388;
  uint32_t local_384;
  string local_380 [32];
  TypeID local_360;
  uint local_35c;
  spirv_cross local_358 [4];
  uint32_t mbr_idx_1;
  spirv_cross local_338 [32];
  string local_318 [8];
  string var_chain_qual;
  string local_2f8 [8];
  string mbr_name_qual;
  string local_2d8 [8];
  string var_name;
  ID local_2b4;
  string local_2b0;
  bool storage_is_stage_io;
  bool attribute_load_store;
  bool is_composite_type;
  ID local_28c;
  VariableID local_288;
  StorageClass local_284;
  SPIRConstant *local_280;
  SPIRConstant *c;
  undefined1 local_270 [4];
  uint32_t initializer;
  SPIRType ptr_type;
  uint32_t local_118;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t ids;
  SPIRType *mbr_type;
  uint local_100;
  uint32_t mbr_idx;
  uint32_t elem_idx;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [36];
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t elem_cnt;
  uint32_t var_mbr_idx;
  uint32_t location;
  bool masked_block;
  bool needs_local_declaration;
  bool block_requires_flattening;
  allocator local_89;
  string local_88 [32];
  uint32_t local_68;
  uint32_t local_64;
  byte local_5d;
  uint32_t local_5c;
  BuiltIn BStack_58;
  bool is_block;
  byte local_51;
  BuiltIn builtin;
  bool is_builtin;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_18;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_18 = this;
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar5);
  if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    local_3f0 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  else {
    local_3f0 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  _builtin = local_3f0;
  local_51 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
  local_5c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  BStack_58 = Compiler::get_decoration((Compiler *)this,(ID)local_5c,DecorationBuiltIn);
  local_64 = (_builtin->super_IVariant).self.id;
  local_5d = Compiler::has_decoration((Compiler *)this,(ID)local_64,DecorationBlock);
  if ((ib_var_ref_local._4_4_ == StorageClassOutput) &&
     (bVar2 = CompilerGLSL::is_stage_output_variable_masked
                        (&this->super_CompilerGLSL,(SPIRVariable *)meta_local), bVar2)) {
    emit_local_masked_variable
              (this,(SPIRVariable *)meta_local,
               (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
  }
  else {
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_68 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_68,DecorationPerVertexKHR);
      if (bVar2) {
        var_mbr_idx._3_1_ = 1;
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_88,"PerVertexKHR decoration is not supported in MSL.",&local_89);
        CompilerError::CompilerError(pCVar8,(string *)local_88);
        var_mbr_idx._3_1_ = 0;
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    uVar5 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
    if (*(int *)&(_builtin->super_IVariant).field_0xc == 0xf) {
      bVar2 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
      local_401 = true;
      if (!bVar2) {
        local_402 = false;
        if ((local_5d & 1) != 0) {
          local_402 = VectorView<unsigned_int>::empty
                                (&(_builtin->array).super_VectorView<unsigned_int>);
        }
        local_401 = local_402;
      }
      var_mbr_idx._2_1_ = local_401;
      local_403 = 0;
      if (((local_51 & 1) == 0) && (local_403 = 0, local_401 != false)) {
        local_403 = (entry_func->arguments).stack_storage.aligned_char[9];
      }
      var_mbr_idx._1_1_ = local_403 & 1;
      if (var_mbr_idx._1_1_ != 0) {
        emit_local_masked_variable
                  (this,(SPIRVariable *)meta_local,
                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
      }
      if ((var_mbr_idx._2_1_ & 1) == 0) {
        add_plain_variable_to_interface_block
                  (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                   (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
      }
      else {
        var_mbr_idx._0_1_ = 0;
        elem_cnt = 0xffffffff;
        local_a8 = 0;
        local_ac = 1;
        bVar2 = Compiler::is_matrix((Compiler *)this,_builtin);
        if (bVar2) {
          bVar2 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar2) {
            local_d2 = 1;
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_d0,"MSL cannot emit arrays-of-matrices in input and output variables.",
                       &local_d1);
            CompilerError::CompilerError(pCVar8,(string *)local_d0);
            local_d2 = 0;
            __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          local_ac = _builtin->columns;
        }
        else {
          bVar2 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar2) {
            sVar9 = VectorView<unsigned_int>::size
                              (&(_builtin->array).super_VectorView<unsigned_int>);
            if (sVar9 != 1) {
              mbr_idx._2_1_ = 1;
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&elem_idx,
                         "MSL cannot emit arrays-of-arrays in input and output variables.",
                         (allocator *)((long)&mbr_idx + 3));
              CompilerError::CompilerError(pCVar8,(string *)&elem_idx);
              mbr_idx._2_1_ = 0;
              __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            local_ac = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,_builtin);
          }
        }
        for (local_100 = 0; local_100 < local_ac; local_100 = local_100 + 1) {
          for (mbr_type._4_4_ = 0; uVar1 = mbr_type._4_4_,
              sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(_builtin->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
              uVar1 < (uint)sVar9; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
            BStack_58 = BuiltInMax;
            local_51 = Compiler::is_member_builtin
                                 ((Compiler *)this,_builtin,mbr_type._4_4_,&stack0xffffffffffffffa8)
            ;
            pTVar10 = (TypedID *)
                      VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                (&(_builtin->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                                 (ulong)mbr_type._4_4_);
            uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar10);
            _ptr_type_id = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            if ((ib_var_ref_local._4_4_ == StorageClassOutput) &&
               (bVar2 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,(SPIRVariable *)meta_local,
                                   mbr_type._4_4_,
                                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1)
                                  ), bVar2)) {
              elem_cnt = 0xffffffff;
              if ((local_5d & 1) != 0) {
                var_mbr_idx._0_1_ = 1;
              }
              if (((local_51 & 1) != 0) &&
                 (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) {
                local_118 = ParsedIR::increase_bound_by
                                      (&(this->super_CompilerGLSL).super_Compiler.ir,2);
                ptr_type.member_name_cache._M_h._M_single_bucket._4_4_ = local_118 + 1;
                var_id = local_118;
                SPIRType::SPIRType((SPIRType *)local_270,_ptr_type_id);
                ptr_type.array_size_literal.stack_storage.aligned_char[4] = '\x01';
                ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ =
                     ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
                pTVar11 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                    (&(_builtin->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                     ,(ulong)mbr_type._4_4_);
                ptr_type.image.access = pTVar11->id;
                ptr_type.pointer_depth = 3;
                c._4_4_ = 0;
                uVar5 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                if (uVar5 != 0) {
                  uVar5 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                  local_280 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar5)
                  ;
                  if (local_280 != (SPIRConstant *)0x0) {
                    pTVar10 = (TypedID *)
                              VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                                        (&(local_280->subconstants).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>
                                         ,(ulong)mbr_type._4_4_);
                    c._4_4_ = TypedID::operator_cast_to_unsigned_int(pTVar10);
                  }
                }
                Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,local_118,(SPIRType *)local_270);
                local_284 = StorageClassOutput;
                Compiler::
                set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                          ((Compiler *)this,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_,
                           &local_118,&local_284,(uint *)((long)&c + 4));
                this_00 = var_type;
                TypedID<(spirv_cross::Types)2>::TypedID
                          (&local_288,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                SPIRFunction::add_local_variable((SPIRFunction *)this_00,local_288);
                SmallVector<unsigned_int,_8UL>::push_back
                          (&this->vars_needing_early_declaration,
                           (uint *)((long)&ptr_type.member_name_cache._M_h._M_single_bucket + 4));
                TypedID<(spirv_cross::Types)0>::TypedID
                          (&local_28c,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                          (&local_2b0,this,(ulong)BStack_58,3);
                Compiler::set_name((Compiler *)this,local_28c,&local_2b0);
                ::std::__cxx11::string::~string((string *)&local_2b0);
                TypedID<(spirv_cross::Types)0>::TypedID
                          (&local_2b4,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                Compiler::set_decoration((Compiler *)this,local_2b4,DecorationBuiltIn,BStack_58);
                SPIRType::~SPIRType((SPIRType *)local_270);
              }
            }
            else if (((local_51 & 1) == 0) ||
                    (bVar2 = Compiler::has_active_builtin
                                       ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar2))
            {
              bVar3 = Compiler::is_matrix((Compiler *)this,_ptr_type_id);
              bVar2 = true;
              if (!bVar3) {
                bVar3 = Compiler::is_array((Compiler *)this,_ptr_type_id);
                bVar2 = true;
                if (!bVar3) {
                  bVar2 = *(int *)&(_ptr_type_id->super_IVariant).field_0xc == 0xf;
                }
              }
              bVar3 = false;
              if (ib_var_ref_local._4_4_ == StorageClassInput) {
                EVar6 = Compiler::get_execution_model((Compiler *)this);
                bVar3 = EVar6 != ExecutionModelFragment;
              }
              bVar4 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
              if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
                local_51 = 0;
              }
              uVar5 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_2d8,this,(ulong)uVar5,1);
              ::std::__cxx11::string::string(local_2f8,local_2d8);
              ::std::__cxx11::string::string(local_318,local_2d8);
              if (1 < local_ac) {
                join<char_const(&)[2],unsigned_int&>(local_338,(char (*) [2])0x5b8878,&local_100);
                ::std::__cxx11::string::operator+=(local_2f8,(string *)local_338);
                ::std::__cxx11::string::~string((string *)local_338);
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          (local_358,(char (*) [2])0x5b2ad8,&local_100,(char (*) [2])0x5ab046);
                ::std::__cxx11::string::operator+=(local_318,(string *)local_358);
                ::std::__cxx11::string::~string((string *)local_358);
              }
              if (((((local_51 & 1) == 0) || (bVar3)) && (bVar4)) && (bVar2)) {
                add_composite_member_variable_to_interface_block
                          (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local
                           ,(SPIRVariable *)meta_local,_builtin,mbr_type._4_4_,
                           (InterfaceBlockMeta *)entry_func,(string *)local_2f8,(string *)local_318,
                           &elem_cnt,&local_a8);
              }
              else {
                add_plain_member_variable_to_interface_block
                          (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local
                           ,(SPIRVariable *)meta_local,_builtin,mbr_type._4_4_,
                           (InterfaceBlockMeta *)entry_func,(string *)local_2f8,(string *)local_318,
                           &elem_cnt,&local_a8);
              }
              ::std::__cxx11::string::~string(local_318);
              ::std::__cxx11::string::~string(local_2f8);
              ::std::__cxx11::string::~string(local_2d8);
            }
            local_a8 = local_a8 + 1;
          }
        }
        if (((((byte)var_mbr_idx & 1) != 0) && ((var_mbr_idx._1_1_ & 1) == 0)) &&
           ((bVar2 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local),
            !bVar2 || (bVar2 = is_tesc_shader(this), bVar2)))) {
          bVar2 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
          if (bVar2) {
            for (local_35c = 0; uVar1 = local_35c,
                sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                  (&(_builtin->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
                uVar1 < (uint)sVar9; local_35c = local_35c + 1) {
              local_360.id = (uint32_t)
                             TypedID::operator_cast_to_TypedID
                                       ((TypedID *)&(_builtin->super_IVariant).self);
              uVar1 = local_35c;
              local_384 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(_builtin->super_IVariant).self);
              uVar5 = Compiler::get_member_decoration
                                ((Compiler *)this,(TypeID)local_384,local_35c,DecorationBuiltIn);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (local_380,this,(ulong)uVar5,3);
              Compiler::set_member_name((Compiler *)this,local_360,uVar1,local_380);
              ::std::__cxx11::string::~string((string *)local_380);
            }
            local_388.id = (_builtin->super_IVariant).self.id;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_3a8,"gl_PerVertex",&local_3a9);
            Compiler::set_name((Compiler *)this,local_388,(string *)local_3a8);
            ::std::__cxx11::string::~string(local_3a8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
            local_3b0.id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3d0,"gl_out_masked",(allocator *)&is_composite_type_1);
            Compiler::set_name((Compiler *)this,local_3b0,(string *)local_3d0);
            ::std::__cxx11::string::~string(local_3d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&is_composite_type_1);
            TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(_builtin->super_IVariant).self);
            (this->stage_out_masked_builtin_type_id).id = TVar7.id;
          }
          emit_local_masked_variable
                    (this,(SPIRVariable *)meta_local,
                     (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
        }
      }
    }
    else {
      bVar2 = is_tese_shader(this);
      if ((((bVar2) && (ib_var_ref_local._4_4_ == StorageClassInput)) &&
          (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) &&
         (((local_51 & 1) != 0 &&
          ((BStack_58 == BuiltInTessLevelOuter || (BStack_58 == BuiltInTessLevelInner)))))) {
        add_tess_level_input_to_interface_block
                  (this,(string *)ib_type_local,(SPIRType *)var_local,(SPIRVariable *)meta_local);
      }
      else if ((((*(int *)&(_builtin->super_IVariant).field_0xc == 2) ||
                (*(int *)&(_builtin->super_IVariant).field_0xc == 0x17)) ||
               ((bVar2 = type_is_integral(_builtin), bVar2 ||
                (bVar2 = type_is_floating_point(_builtin), bVar2)))) &&
              (((local_51 & 1) == 0 ||
               (bVar2 = Compiler::has_active_builtin
                                  ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar2)))) {
        bVar2 = Compiler::is_matrix((Compiler *)this,_builtin);
        local_489 = true;
        if (!bVar2) {
          local_489 = Compiler::is_array((Compiler *)this,_builtin);
        }
        bVar3 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
        bVar2 = false;
        if (ib_var_ref_local._4_4_ == StorageClassInput) {
          EVar6 = Compiler::get_execution_model((Compiler *)this);
          bVar2 = EVar6 != ExecutionModelFragment;
        }
        if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
          local_51 = 0;
        }
        if (((((local_51 & 1) == 0) || (bVar2)) && (bVar3)) && (local_489 != false)) {
          add_composite_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
        else {
          add_plain_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx);
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}